

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gherkin_cli.c
# Opt level: O0

wchar_t main(wchar_t argc,char **argv)

{
  char *uri;
  Location location;
  _Bool _Var1;
  Options OVar2;
  wchar_t wVar3;
  TokenMatcher *token_matcher_00;
  IdGenerator *id_generator_00;
  Builder *builder_00;
  Parser *parser_00;
  Compiler *compiler_00;
  FileReader *file_reader_00;
  wchar_t *source;
  SourceEvent *event;
  TokenScanner *token_scanner_00;
  GherkinDocument *gherkin_document;
  GherkinDocumentEvent *event_00;
  Pickle *pickle;
  PickleEvent *event_01;
  Error *error_00;
  ErrorEvent *error_event_00;
  ErrorEvent *error_event;
  Error *error;
  Event *pickle_event;
  GherkinDocumentEvent *gherkin_document_event;
  TokenScanner *token_scanner;
  SourceEvent *source_event;
  FileReader *file_reader;
  wchar_t i;
  wchar_t result_code;
  wchar_t return_code;
  Compiler *compiler;
  Parser *parser;
  Builder *builder;
  IdGenerator *id_generator;
  TokenMatcher *token_matcher;
  Options options;
  char **argv_local;
  wchar_t argc_local;
  
  setlocale(6,"en_US.UTF-8");
  OVar2 = parse_options(argc,argv);
  token_matcher_00 = TokenMatcher_new(L"en");
  id_generator_00 = IncrementingIdGenerator_new();
  builder_00 = AstBuilder_new(id_generator_00);
  parser_00 = Parser_new(builder_00);
  compiler_00 = Compiler_new(id_generator_00);
  i = L'\0';
  for (file_reader._4_4_ = L'\x01'; file_reader._4_4_ < argc;
      file_reader._4_4_ = file_reader._4_4_ + L'\x01') {
    if (*argv[file_reader._4_4_] != '-') {
      file_reader_00 = FileReader_new(argv[file_reader._4_4_]);
      uri = argv[file_reader._4_4_];
      source = FileReader_read(file_reader_00);
      event = SourceEvent_new(uri,source);
      FileReader_delete(file_reader_00);
      if (((uint3)OVar2 & 1) != 0) {
        Event_print(&event->event,_stdout);
      }
      token_scanner_00 = StringTokenScanner_new(event->source);
      wVar3 = Parser_parse(parser_00,token_matcher_00,token_scanner_00);
      if (wVar3 == L'\0') {
        gherkin_document = AstBuilder_get_result(builder_00,argv[file_reader._4_4_]);
        event_00 = GherkinDocumentEvent_new(gherkin_document);
        if (((uint3)OVar2 & 0x100) != 0) {
          Event_print(&event_00->event,_stdout);
        }
        wVar3 = Compiler_compile(compiler_00,event_00->gherkin_document,event->source);
        Event_delete(&event_00->event);
        if ((wVar3 == L'\0') && (wVar3 = i, ((uint3)OVar2 & 0x10000) != 0)) {
          while (_Var1 = Compiler_has_more_pickles(compiler_00), _Var1) {
            pickle = Compiler_next_pickle(compiler_00);
            event_01 = PickleEvent_new(pickle);
            Event_print(&event_01->event,_stdout);
            Event_delete(&event_01->event);
          }
        }
      }
      else {
        while (_Var1 = Parser_has_more_errors(parser_00), _Var1) {
          error_00 = Parser_next_error(parser_00);
          location.line = (error_00->location).line;
          location.column = (error_00->location).column;
          error_event_00 = ErrorEvent_new(argv[file_reader._4_4_],location);
          ErrorEvent_transfer_error_text(error_event_00,error_00);
          Event_print(&error_event_00->event,_stdout);
          Event_delete(&error_event_00->event);
          Error_delete(error_00);
        }
      }
      i = wVar3;
      TokenScanner_delete(token_scanner_00);
      Event_delete(&event->event);
    }
  }
  Compiler_delete(compiler_00);
  Parser_delete(parser_00);
  AstBuilder_delete(builder_00);
  (*id_generator_00->id_generator_delete)(id_generator_00);
  TokenMatcher_delete(token_matcher_00);
  return i;
}

Assistant:

int main(int argc, char** argv) {
    setlocale(LC_ALL, "en_US.UTF-8");
    Options options = parse_options(argc, argv);
    TokenMatcher* token_matcher = TokenMatcher_new(L"en");
    IdGenerator* id_generator = IncrementingIdGenerator_new();
    Builder* builder = AstBuilder_new(id_generator);
    Parser* parser = Parser_new(builder);
    Compiler* compiler = Compiler_new(id_generator);
    int return_code = 0;
    int result_code = 0;
    int i;
    for (i = 1; i < argc; ++i) {
        if (argv[i][0] == '-') {
            continue;
        }
        FileReader* file_reader = FileReader_new(argv[i]);
        SourceEvent* source_event = SourceEvent_new(argv[i], FileReader_read(file_reader));
        FileReader_delete(file_reader);
        if (options.print_source_events) {
            Event_print((const Event*)source_event, stdout);
        }
        TokenScanner* token_scanner = StringTokenScanner_new(source_event->source);
        result_code = Parser_parse(parser, token_matcher, token_scanner);
        if (result_code == 0) {
            const GherkinDocumentEvent* gherkin_document_event = GherkinDocumentEvent_new(AstBuilder_get_result(builder, argv[i]));
            if (options.print_ast_events) {
                Event_print((const Event*)gherkin_document_event, stdout);
            }
            result_code = Compiler_compile(compiler, gherkin_document_event->gherkin_document, source_event->source);
            Event_delete((const Event*)gherkin_document_event);
            if (result_code == 0) {
                if (options.print_pickle_events) {
                    while (Compiler_has_more_pickles(compiler)) {
                        const Event* pickle_event = (const Event*)PickleEvent_new(Compiler_next_pickle(compiler));
                        Event_print(pickle_event, stdout);
                        Event_delete(pickle_event);
                    }
                }
            }
            else {
                return_code = result_code;
            }
        }
        else {
            return_code = result_code;
            while (Parser_has_more_errors(parser)) {
                Error* error = Parser_next_error(parser);
                ErrorEvent* error_event = ErrorEvent_new(argv[i], error->location);
                ErrorEvent_transfer_error_text(error_event, error);
                Event_print((Event*)error_event, stdout);
                Event_delete((Event*)error_event);
                Error_delete(error);
            }
        }
        TokenScanner_delete(token_scanner);
        Event_delete((const Event*)source_event);
    }
    Compiler_delete(compiler);
    Parser_delete(parser);
    AstBuilder_delete(builder);
    id_generator->id_generator_delete(id_generator);
    TokenMatcher_delete(token_matcher);
    return return_code;
}